

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_persistence_from_file.h
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
Gudhi::Persistence_representations::read_persistence_intervals_in_one_dimension_from_file
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Persistence_representations *this,string *filename,int dimension,
          double what_to_substitute_for_infinite_bar)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_t i;
  long lVar4;
  long lVar5;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> barcode_initial;
  string line;
  pair<double,_double> local_68;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  read_persistence_intervals_in_dimension
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &local_58,(Gudhi *)this,filename,dimension);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::reserve
            (__return_storage_ptr__,
             (long)local_58._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar5 = 0;
  for (lVar4 = 0;
      lVar4 != (long)local_58._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4; lVar4 = lVar4 + 1) {
    dVar1 = *(double *)((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->first + lVar5);
    dVar2 = *(double *)((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->second + lVar5);
    if (dVar1 <= dVar2) {
      if (INFINITY <= dVar2) {
        bVar3 = true;
      }
      else {
        local_68.second =
             *(double *)((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->second + lVar5)
        ;
        local_68.first = dVar1;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_68);
        bVar3 = INFINITY <=
                *(double *)
                 ((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->second + lVar5);
      }
      if ((((what_to_substitute_for_infinite_bar != -1.0) ||
           (NAN(what_to_substitute_for_infinite_bar))) && (bVar3)) &&
         (dVar1 = *(double *)
                   ((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->first + lVar5),
         dVar1 < what_to_substitute_for_infinite_bar)) {
        local_68.first = dVar1;
        local_68.second = what_to_substitute_for_infinite_bar;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_68);
      }
    }
    else {
      local_68.second =
           *(double *)((long)&(local_58._M_impl.super__Vector_impl_data._M_start)->first + lVar5);
      local_68.first = dVar2;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 __return_storage_ptr__,&local_68);
    }
    lVar5 = lVar5 + 0x10;
  }
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double> > read_persistence_intervals_in_one_dimension_from_file(
    std::string const& filename, int dimension = -1, double what_to_substitute_for_infinite_bar = -1) {
  bool dbg = false;

  std::string line;
  std::vector<std::pair<double, double> > barcode_initial =
      read_persistence_intervals_in_dimension(filename, static_cast<int>(dimension));
  std::vector<std::pair<double, double> > final_barcode;
  final_barcode.reserve(barcode_initial.size());

  if (dbg) {
    std::clog << "Here are the intervals that we read from the file : \n";
    for (size_t i = 0; i != barcode_initial.size(); ++i) {
      std::clog << barcode_initial[i].first << " " << barcode_initial[i].second << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != barcode_initial.size(); ++i) {
    if (dbg) {
      std::clog << "Considering interval : " << barcode_initial[i].first << " " << barcode_initial[i].second
                << std::endl;
    }

    if (barcode_initial[i].first > barcode_initial[i].second) {
      // note that in this case barcode_initial[i].second != std::numeric_limits<double>::infinity()
      if (dbg) std::clog << "Swap and enter \n";
      // swap them to make sure that birth < death
      final_barcode.push_back(std::pair<double, double>(barcode_initial[i].second, barcode_initial[i].first));
      continue;
    } else {
      if (barcode_initial[i].second != std::numeric_limits<double>::infinity()) {
        if (dbg) std::clog << "Simply enters\n";
        // in this case, due to the previous conditions we know that barcode_initial[i].first <
        // barcode_initial[i].second, so we put them as they are
        final_barcode.push_back(std::pair<double, double>(barcode_initial[i].first, barcode_initial[i].second));
      }
    }

    if ((barcode_initial[i].second == std::numeric_limits<double>::infinity()) &&
        (what_to_substitute_for_infinite_bar != -1)) {
      if (barcode_initial[i].first < what_to_substitute_for_infinite_bar) {
        // if only birth < death.
        final_barcode.push_back(
            std::pair<double, double>(barcode_initial[i].first, what_to_substitute_for_infinite_bar));
      }
    } else {
      // if the variable what_to_substitute_for_infinite_bar is not set, then we ignore all the infinite bars.
    }
  }

  if (dbg) {
    std::clog << "Here are the final bars that we are sending further : \n";
    for (size_t i = 0; i != final_barcode.size(); ++i) {
      std::clog << final_barcode[i].first << " " << final_barcode[i].second << std::endl;
    }
    std::clog << "final_barcode.size() : " << final_barcode.size() << std::endl;
    getchar();
  }

  return final_barcode;
}